

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::emitScopeEnd
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Expression *curr)

{
  Expression *curr_local;
  BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this_local;
  
  anon_unknown_18::Poppifier::emitScopeEnd((Poppifier *)this,curr);
  return;
}

Assistant:

void emitScopeEnd(Expression* curr) {
    static_cast<SubType*>(this)->emitScopeEnd(curr);
  }